

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O3

BOOL __thiscall
Js::JavascriptRegExpConstructor::DeleteProperty
          (JavascriptRegExpConstructor *this,JavascriptString *propertyNameString,
          PropertyOperationFlags flags)

{
  int iVar1;
  ScriptContext *scriptContext;
  BOOL BVar2;
  char16 *varName;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord;
  
  local_30 = (PropertyRecord *)0x0;
  ScriptContext::GetOrAddPropertyRecord
            ((((((propertyNameString->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,propertyNameString,&local_30);
  iVar1 = local_30->pid;
  auVar6._0_4_ = -(uint)(BuiltInPropertyRecords::_3._8_4_ == iVar1);
  auVar6._4_4_ = -(uint)(BuiltInPropertyRecords::_4._8_4_ == iVar1);
  auVar6._8_4_ = -(uint)(BuiltInPropertyRecords::_5._8_4_ == iVar1);
  auVar6._12_4_ = -(uint)(BuiltInPropertyRecords::_6._8_4_ == iVar1);
  auVar5._0_4_ = -(uint)(BuiltInPropertyRecords::rightContext._8_4_ == iVar1);
  auVar5._4_4_ = -(uint)(BuiltInPropertyRecords::_Tick._8_4_ == iVar1);
  auVar5._8_4_ = -(uint)(BuiltInPropertyRecords::_1._8_4_ == iVar1);
  auVar5._12_4_ = -(uint)(BuiltInPropertyRecords::_2._8_4_ == iVar1);
  auVar5 = packssdw(auVar5,auVar6);
  auVar3._0_4_ = -(uint)((int)BuiltInPropertyRecords::input._8_8_ == iVar1);
  auVar3._4_4_ = -(uint)(BuiltInPropertyRecords::__._8_4_ == iVar1);
  auVar3._8_4_ = -(uint)(BuiltInPropertyRecords::lastMatch._8_4_ == iVar1);
  auVar3._12_4_ = -(uint)(BuiltInPropertyRecords::_Ampersand._8_4_ == iVar1);
  auVar4._0_4_ = -(uint)(BuiltInPropertyRecords::lastParen._8_4_ == iVar1);
  auVar4._4_4_ = -(uint)(BuiltInPropertyRecords::_Plus._8_4_ == iVar1);
  auVar4._8_4_ = -(uint)(BuiltInPropertyRecords::leftContext._8_4_ == iVar1);
  auVar4._12_4_ = -(uint)(BuiltInPropertyRecords::_BackTick._8_4_ == iVar1);
  auVar3 = packssdw(auVar3,auVar4);
  auVar3 = packsswb(auVar3,auVar5);
  if (((((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar3 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar3 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar3 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar3 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar3 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar3 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar3 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar3 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar3 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar3 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar3 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar3 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar3 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar3 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar3[0xf]) &&
       (iVar1 != BuiltInPropertyRecords::_7._8_4_)) && (iVar1 != BuiltInPropertyRecords::_8._8_4_))
     && ((iVar1 != BuiltInPropertyRecords::_9._8_4_ &&
         (iVar1 != BuiltInPropertyRecords::index._8_4_)))) {
    BVar2 = JavascriptFunction::DeleteProperty((JavascriptFunction *)this,propertyNameString,flags);
  }
  else {
    scriptContext =
         (((((this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
             super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase)
         .scriptContext.ptr;
    varName = JavascriptString::GetString(propertyNameString);
    JavascriptError::ThrowCantDeleteIfStrictMode(flags,scriptContext,varName);
    BVar2 = 0;
  }
  return BVar2;
}

Assistant:

BOOL JavascriptRegExpConstructor::DeleteProperty(JavascriptString *propertyNameString, PropertyOperationFlags flags)
    {
        PropertyRecord const * propertyRecord = nullptr;
        propertyNameString->GetScriptContext()->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        PropertyId propertyId = propertyRecord->GetPropertyId();

        if (BuiltInPropertyRecords::input.Equals(propertyId)
            || BuiltInPropertyRecords::$_.Equals(propertyId)
            || BuiltInPropertyRecords::lastMatch.Equals(propertyId)
            || BuiltInPropertyRecords::$Ampersand.Equals(propertyId)
            || BuiltInPropertyRecords::lastParen.Equals(propertyId)
            || BuiltInPropertyRecords::$Plus.Equals(propertyId)
            || BuiltInPropertyRecords::leftContext.Equals(propertyId)
            || BuiltInPropertyRecords::$BackTick.Equals(propertyId)
            || BuiltInPropertyRecords::rightContext.Equals(propertyId)
            || BuiltInPropertyRecords::$Tick.Equals(propertyId)
            || BuiltInPropertyRecords::$1.Equals(propertyId)
            || BuiltInPropertyRecords::$2.Equals(propertyId)
            || BuiltInPropertyRecords::$3.Equals(propertyId)
            || BuiltInPropertyRecords::$4.Equals(propertyId)
            || BuiltInPropertyRecords::$5.Equals(propertyId)
            || BuiltInPropertyRecords::$6.Equals(propertyId)
            || BuiltInPropertyRecords::$7.Equals(propertyId)
            || BuiltInPropertyRecords::$8.Equals(propertyId)
            || BuiltInPropertyRecords::$9.Equals(propertyId)
            || BuiltInPropertyRecords::index.Equals(propertyId))
        {
            JavascriptError::ThrowCantDeleteIfStrictMode(flags, GetScriptContext(), propertyNameString->GetString());
            return false;
        }

        return JavascriptFunction::DeleteProperty(propertyNameString, flags);
    }